

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isResultInSet(CmpResultSet resultSet,float result,int resultBits)

{
  byte bVar1;
  float fVar2;
  
  fVar2 = TexVerifierUtil::computeFixedPointError(resultBits);
  if (((((ushort)resultSet & 1) == 0) || (1.0 < result - fVar2)) ||
     (bVar1 = 1, fVar2 + result < 1.0)) {
    if (((ushort)resultSet >> 8 & 1) == 0) {
      bVar1 = 0;
    }
    else {
      bVar1 = -(0.0 <= fVar2 + result && result - fVar2 <= 0.0);
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static inline bool isResultInSet (const CmpResultSet resultSet, const float result, const int resultBits)
{
	const float err		= computeFixedPointError(resultBits);
	const float	minR	= result-err;
	const float	maxR	= result+err;

	return (resultSet.isTrue	&& de::inRange(1.0f, minR, maxR)) ||
		   (resultSet.isFalse	&& de::inRange(0.0f, minR, maxR));
}